

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O2

double brotli::PopulationCost<704>(Histogram<704> *histogram)

{
  int i;
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  size_t size;
  ulong uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  uint32_t local_348 [20];
  uint8_t depth_array [704];
  
  sVar3 = histogram->total_count_;
  dVar8 = 12.0;
  if (sVar3 != 0) {
    uVar4 = 0;
    for (lVar1 = 0; lVar1 != 0x2c0; lVar1 = lVar1 + 1) {
      uVar4 = (uVar4 + 1) - (uint)(histogram->data_[lVar1] == 0);
    }
    if (uVar4 != 1) {
      if (uVar4 == 2) {
        lVar1 = sVar3 + 0x14;
        auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar12._0_8_ = lVar1;
        auVar12._12_4_ = 0x45300000;
        dVar8 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
      }
      else {
        iVar7 = 0;
        size = 0;
        memset(depth_array,0,0x2c0);
        if (uVar4 < 5) {
          CreateHuffmanTree(histogram->data_,0x2c0,0xf,depth_array);
          dVar8 = 0.0;
          for (lVar1 = 0; lVar1 != 0x2c0; lVar1 = lVar1 + 1) {
            dVar8 = dVar8 + (double)((uint)depth_array[lVar1] * histogram->data_[lVar1]);
          }
          dVar8 = dVar8 + *(double *)(&DAT_001be130 + (ulong)(uVar4 == 3) * 8);
        }
        else {
          local_348[0xc] = 0;
          local_348[0xd] = 0;
          local_348[0xe] = 0;
          local_348[0xf] = 0;
          local_348[8] = 0;
          local_348[9] = 0;
          local_348[10] = 0;
          local_348[0xb] = 0;
          local_348[4] = 0;
          local_348[5] = 0;
          local_348[6] = 0;
          local_348[7] = 0;
          local_348[0] = 0;
          local_348[1] = 0;
          local_348[2] = 0;
          local_348[3] = 0;
          local_348[0x10] = 0;
          local_348[0x11] = 0;
          dVar8 = FastLog2(sVar3);
          uVar6 = 1;
          dVar11 = 0.0;
          uVar5 = 0;
          while (uVar5 < 0x2c0) {
            if ((ulong)histogram->data_[uVar5] == 0) {
              uVar4 = 0x2c0 - (int)uVar5;
              size = 0x2bf - uVar5;
              for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
                if (histogram->data_[uVar5 + sVar3 + 1] != 0) {
                  uVar4 = (int)sVar3 + 1;
                  break;
                }
              }
              uVar5 = uVar5 + uVar4;
              if (uVar5 == 0x2c0) break;
              if (uVar4 < 3) {
                local_348[0] = local_348[0] + uVar4;
              }
              else {
                for (uVar4 = uVar4 - 2; uVar4 != 0; uVar4 = uVar4 >> 3) {
                  iVar7 = iVar7 + 1;
                  dVar11 = dVar11 + 3.0;
                }
              }
            }
            else {
              dVar9 = FastLog2((ulong)histogram->data_[uVar5]);
              dVar10 = (dVar8 - dVar9) + 0.5;
              uVar2 = (ulong)dVar10;
              uVar2 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
              dVar11 = dVar11 + (double)histogram->data_[uVar5] * (dVar8 - dVar9);
              if (0xe < uVar2) {
                uVar2 = 0xf;
              }
              if (uVar6 < uVar2) {
                uVar6 = uVar2;
              }
              local_348[uVar2 & 0xffffffff] = local_348[uVar2 & 0xffffffff] + 1;
              uVar5 = uVar5 + 1;
            }
          }
          local_348[0x11] = iVar7;
          dVar8 = BitsEntropy(local_348,size);
          dVar8 = dVar8 + dVar11 + (double)(long)(uVar6 * 2 + 0x12);
        }
      }
    }
  }
  return dVar8;
}

Assistant:

double PopulationCost(const Histogram<kSize>& histogram) {
  if (histogram.total_count_ == 0) {
    return 12;
  }
  int count = 0;
  for (int i = 0; i < kSize; ++i) {
    if (histogram.data_[i] > 0) {
      ++count;
    }
  }
  if (count == 1) {
    return 12;
  }
  if (count == 2) {
    return static_cast<double>(20 + histogram.total_count_);
  }
  double bits = 0;
  uint8_t depth_array[kSize] = { 0 };
  if (count <= 4) {
    // For very low symbol count we build the Huffman tree.
    CreateHuffmanTree(&histogram.data_[0], kSize, 15, depth_array);
    for (int i = 0; i < kSize; ++i) {
      bits += histogram.data_[i] * depth_array[i];
    }
    return count == 3 ? bits + 28 : bits + 37;
  }

  // In this loop we compute the entropy of the histogram and simultaneously
  // build a simplified histogram of the code length codes where we use the
  // zero repeat code 17, but we don't use the non-zero repeat code 16.
  size_t max_depth = 1;
  uint32_t depth_histo[kCodeLengthCodes] = { 0 };
  const double log2total = FastLog2(histogram.total_count_);
  for (size_t i = 0; i < kSize;) {
    if (histogram.data_[i] > 0) {
      // Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
      //                          =  log2(total_count) - log2(count(symbol))
      double log2p = log2total - FastLog2(histogram.data_[i]);
      // Approximate the bit depth by round(-log2(P(symbol)))
      size_t depth = static_cast<size_t>(log2p + 0.5);
      bits += histogram.data_[i] * log2p;
      if (depth > 15) {
        depth = 15;
      }
      if (depth > max_depth) {
        max_depth = depth;
      }
      ++depth_histo[depth];
      ++i;
    } else {
      // Compute the run length of zeros and add the appropriate number of 0 and
      // 17 code length codes to the code length code histogram.
      uint32_t reps = 1;
      for (size_t k = i + 1; k < kSize && histogram.data_[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      if (i == kSize) {
        // Don't add any cost for the last zero run, since these are encoded
        // only implicitly.
        break;
      }
      if (reps < 3) {
        depth_histo[0] += reps;
      } else {
        reps -= 2;
        while (reps > 0) {
          ++depth_histo[17];
          // Add the 3 extra bits for the 17 code length code.
          bits += 3;
          reps >>= 3;
        }
      }
    }
  }
  // Add the estimated encoding cost of the code length code histogram.
  bits += static_cast<double>(18 + 2 * max_depth);
  // Add the entropy of the code length code histogram.
  bits += BitsEntropy(depth_histo, kCodeLengthCodes);
  return bits;
}